

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CPU.cpp
# Opt level: O1

int __thiscall CPU::instrLDY0xbc(CPU *this)

{
  byte bVar1;
  
  bVar1 = absolute_x_addr(this);
  this->Y = bVar1;
  this->field_0x2e = bVar1 >> 7 | (bVar1 == 0) << 6 | this->field_0x2e & 0xbe;
  return 4;
}

Assistant:

int CPU::instrLDY0xbc() {
	LDY(absolute_x_addr());
	return 4;
}